

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O2

void wasm::printElement(ostream *os,Element *elem,int depth)

{
  char cVar1;
  Element *elem_00;
  Element *pEVar2;
  ostream *poVar3;
  Element *pEVar4;
  char *pcVar5;
  RandomElement<wasm::RandomLattice> *e;
  
  elem_00 = (Element *)
            (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
            super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
            _M_head_impl;
  if ((elem_00 != (Element *)0x0) &&
     (*(char *)&elem_00[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Tuple_impl<1UL,_void_(*)(void_*)>.
                super__Head_base<1UL,_void_(*)(void_*),_false> == '\0')) {
    printFullElement(os,elem_00,depth);
    return;
  }
  indent(os,depth);
  pEVar4 = (Element *)
           (elem->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
           super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
           _M_head_impl;
  if (pEVar4 == (Element *)0x0) {
switchD_001a481a_default:
    wasm::handle_unreachable
              ("unexpected element",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
               ,499);
  }
  switch(*(undefined1 *)
          &pEVar4[2].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
           super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>
           .super__Head_base<1UL,_void_(*)(void_*),_false>) {
  case 1:
    cVar1 = *(char *)((long)&(pEVar4->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                             super__Tuple_impl<1UL,_void_(*)(void_*)> + 4);
    if (cVar1 == '\x02') {
      pcVar5 = "flat top\n";
    }
    else if (cVar1 == '\0') {
      pcVar5 = "flat bot\n";
    }
    else {
      poVar3 = std::operator<<(os,"flat ");
      os = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      pcVar5 = "\n";
    }
    goto LAB_001a4944;
  case 2:
    if (*(char *)&pEVar4[1].super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Tuple_impl<1UL,_void_(*)(void_*)>.
                  super__Head_base<1UL,_void_(*)(void_*),_false> == '\0') {
      pcVar5 = "lift bot\n";
      goto LAB_001a4944;
    }
    std::operator<<(os,"Lifted(\n");
    break;
  case 3:
    std::operator<<(os,"Array[\n");
    printElement(os,pEVar4,depth + 1);
    pEVar4 = pEVar4 + 1;
    break;
  case 4:
    std::operator<<(os,"Vector[\n");
    pEVar2 = (Element *)
             (pEVar4->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
             super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
             _M_head_impl;
    for (pEVar4 = *(Element **)
                   &(pEVar4->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
                    super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                    super__Tuple_impl<1UL,_void_(*)(void_*)>; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1)
    {
      printElement(os,pEVar4,depth + 1);
    }
    indent(os,depth);
    pcVar5 = "]\n";
    goto LAB_001a4944;
  case 5:
    std::operator<<(os,"Tuple(\n");
    printElement(os,pEVar4 + 1,depth + 1);
    break;
  case 6:
    std::operator<<(os,"SharedPath(\n");
    pEVar4 = *(Element **)
              &(pEVar4->super_unique_ptr<void,_void_(*)(void_*)>)._M_t.
               super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
               super__Tuple_impl<1UL,_void_(*)(void_*)>;
    break;
  default:
    goto switchD_001a481a_default;
  }
  printElement(os,pEVar4,depth + 1);
  indent(os,depth);
  pcVar5 = ")\n";
LAB_001a4944:
  std::operator<<(os,pcVar5);
  return;
}

Assistant:

void printElement(std::ostream& os,
                  const typename RandomLattice::Element& elem,
                  int depth = 0) {
  if (const auto* e =
        std::get_if<typename RandomFullLattice::Element>(&*elem)) {
    printFullElement(os, *e, depth);
    return;
  }

  indent(os, depth);

  if (const auto* e = std::get_if<typename Flat<uint32_t>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "flat bot\n";
    } else if (e->isTop()) {
      os << "flat top\n";
    } else {
      os << "flat " << *e->getVal() << "\n";
    }
  } else if (const auto* e =
               std::get_if<typename Lift<RandomLattice>::Element>(&*elem)) {
    if (e->isBottom()) {
      os << "lift bot\n";
    } else {
      os << "Lifted(\n";
      printElement(os, **e, depth + 1);
      indent(os, depth);
      os << ")\n";
    }
  } else if (const auto* e =
               std::get_if<typename ArrayLattice::Element>(&*elem)) {
    os << "Array[\n";
    printElement(os, e->front(), depth + 1);
    printElement(os, e->back(), depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* vec =
               std::get_if<typename Vector<RandomLattice>::Element>(&*elem)) {
    os << "Vector[\n";
    for (const auto& e : *vec) {
      printElement(os, e, depth + 1);
    }
    indent(os, depth);
    os << "]\n";
  } else if (const auto* e =
               std::get_if<typename TupleLattice::Element>(&*elem)) {
    os << "Tuple(\n";
    const auto& [first, second] = *e;
    printElement(os, first, depth + 1);
    printElement(os, second, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else if (const auto* e =
               std::get_if<typename SharedPath<RandomLattice>::Element>(
                 &*elem)) {
    os << "SharedPath(\n";
    printElement(os, **e, depth + 1);
    indent(os, depth);
    os << ")\n";
  } else {
    WASM_UNREACHABLE("unexpected element");
  }
}